

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcUtil.c
# Opt level: O1

Abc_Ntk_t * Abc_NtkFromPla(char **pPlas,int nInputs,int nOutputs)

{
  Abc_Ntk_t *pNtk;
  char *pcVar1;
  Abc_Obj_t *pObj;
  Vec_Ptr_t *pVVar2;
  Abc_Ntk_t *pAVar3;
  ulong uVar4;
  int iVar5;
  long lVar6;
  Fxu_Data_t Params;
  Fxu_Data_t local_90;
  
  pNtk = Abc_NtkAlloc(ABC_NTK_LOGIC,ABC_FUNC_SOP,1);
  pcVar1 = Extra_FileNameGeneric("pla");
  pNtk->pName = pcVar1;
  iVar5 = nInputs;
  if (0 < nInputs) {
    do {
      Abc_NtkCreateObj(pNtk,ABC_OBJ_PI);
      iVar5 = iVar5 + -1;
    } while (iVar5 != 0);
  }
  iVar5 = nOutputs;
  if (0 < nOutputs) {
    do {
      Abc_NtkCreateObj(pNtk,ABC_OBJ_PO);
      iVar5 = iVar5 + -1;
    } while (iVar5 != 0);
  }
  Abc_NtkAddDummyPiNames(pNtk);
  Abc_NtkAddDummyPoNames(pNtk);
  if (0 < nOutputs) {
    uVar4 = 0;
    do {
      pObj = Abc_NtkCreateObj(pNtk,ABC_OBJ_NODE);
      pVVar2 = pNtk->vPis;
      if (0 < pVVar2->nSize) {
        lVar6 = 0;
        do {
          Abc_ObjAddFanin(pObj,(Abc_Obj_t *)pVVar2->pArray[lVar6]);
          lVar6 = lVar6 + 1;
          pVVar2 = pNtk->vPis;
        } while (lVar6 < pVVar2->nSize);
      }
      pcVar1 = Abc_SopRegister((Mem_Flex_t *)pNtk->pManFunc,pPlas[uVar4]);
      (pObj->field_5).pData = pcVar1;
      if ((long)pNtk->vPos->nSize <= (long)uVar4) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      Abc_ObjAddFanin((Abc_Obj_t *)pNtk->vPos->pArray[uVar4],pObj);
      iVar5 = Abc_SopGetVarNum((char *)(pObj->field_5).pData);
      if (iVar5 != nInputs) {
        __assert_fail("Abc_SopGetVarNum((char*)pNode->pData) == nInputs",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abcUtil.c"
                      ,0xac2,"Abc_Ntk_t *Abc_NtkFromPla(char **, int, int)");
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 != (uint)nOutputs);
  }
  iVar5 = Abc_NtkCheck(pNtk);
  if (iVar5 == 0) {
    fwrite("Abc_NtkFromPla(): Network check has failed.\n",0x2c,1,_stdout);
  }
  Abc_NtkSetDefaultFxParams(&local_90);
  Abc_NtkFastExtract(pNtk,&local_90);
  Abc_NtkFxuFreeInfo(&local_90);
  pAVar3 = Abc_NtkStrash(pNtk,0,1,0);
  Abc_NtkDelete(pNtk);
  return pAVar3;
}

Assistant:

Abc_Ntk_t * Abc_NtkFromPla( char ** pPlas, int nInputs, int nOutputs )
{
    Fxu_Data_t Params, * p = &Params;
    Abc_Ntk_t * pNtkSop, * pNtkAig; 
    Abc_Obj_t * pNode, * pFanin;
    int i, k;
    // allocate logic network with SOP local functions
    pNtkSop = Abc_NtkAlloc( ABC_NTK_LOGIC, ABC_FUNC_SOP, 1 );
    pNtkSop->pName = Extra_FileNameGeneric("pla");
    // create primary inputs/outputs
    for ( i = 0; i < nInputs; i++ )
        Abc_NtkCreatePi( pNtkSop );
    for ( i = 0; i < nOutputs; i++ )
        Abc_NtkCreatePo( pNtkSop );
    Abc_NtkAddDummyPiNames( pNtkSop );
    Abc_NtkAddDummyPoNames( pNtkSop );
    // create internal nodes
    for ( i = 0; i < nOutputs; i++ )
    {
        pNode = Abc_NtkCreateNode( pNtkSop );
        Abc_NtkForEachPi( pNtkSop, pFanin, k )
            Abc_ObjAddFanin( pNode, pFanin );
        pNode->pData = Abc_SopRegister( (Mem_Flex_t *)pNtkSop->pManFunc, pPlas[i] );
        Abc_ObjAddFanin( Abc_NtkPo(pNtkSop, i), pNode );
        // check that the number of inputs is the same
        assert( Abc_SopGetVarNum((char*)pNode->pData) == nInputs );
    }
    if ( !Abc_NtkCheck( pNtkSop ) )
        fprintf( stdout, "Abc_NtkFromPla(): Network check has failed.\n" );
    // perform fast_extract
    Abc_NtkSetDefaultFxParams( p );
    Abc_NtkFastExtract( pNtkSop, p );
    Abc_NtkFxuFreeInfo( p );
    // convert to an AIG
    pNtkAig = Abc_NtkStrash( pNtkSop, 0, 1, 0 );
    Abc_NtkDelete( pNtkSop );
    return pNtkAig;
}